

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-face.c
# Opt level: O3

ndn_unix_face_t * ndn_unix_face_construct(char *addr,_Bool client)

{
  int iVar1;
  ndn_unix_face_t *face;
  size_t __n;
  char *__dest;
  code *pcVar2;
  
  face = (ndn_unix_face_t *)malloc(0x10b0);
  if (face != (ndn_unix_face_t *)0x0) {
    (face->intf).face_id = 0xffff;
    iVar1 = ndn_forwarder_register_face((ndn_face_intf_t *)face);
    if (iVar1 == 0) {
      (face->intf).state = '\0';
      (face->intf).type = '\x01';
      pcVar2 = ndn_unix_server_face_up;
      if (client) {
        pcVar2 = ndn_unix_client_face_up;
      }
      (face->intf).up = pcVar2;
      (face->intf).down = ndn_unix_face_down;
      (face->intf).send = ndn_unix_face_send;
      (face->intf).destroy = ndn_unix_face_destroy;
      (face->addr).sun_family = 1;
      if (*addr == '\0') {
        (face->addr).sun_path[0] = '\0';
        __dest = (face->addr).sun_path + 1;
        addr = addr + 1;
        __n = 0x6a;
      }
      else {
        __dest = (face->addr).sun_path;
        __n = 0x6b;
      }
      strncpy(__dest,addr,__n);
      face->client = client;
      face->sock = -1;
      face->offset = 0;
      face->process_event = (ndn_msg *)0x0;
      (*pcVar2)((ndn_face_intf *)face);
      return face;
    }
    free(face);
  }
  return (ndn_unix_face_t *)0x0;
}

Assistant:

ndn_unix_face_t*
ndn_unix_face_construct(const char* addr, bool client){
  ndn_unix_face_t* ret;
  int iret;

  ret = (ndn_unix_face_t*)malloc(sizeof(ndn_unix_face_t));
  if(!ret){
    return NULL;
  }

  ret->intf.face_id = NDN_INVALID_ID;
  iret = ndn_forwarder_register_face(&ret->intf);
  if(iret != NDN_SUCCESS){
    free(ret);
    return NULL;
  }

  ret->intf.type = NDN_FACE_TYPE_APP;
  ret->intf.state = NDN_FACE_STATE_DOWN;
  if(client){
    ret->intf.up = ndn_unix_client_face_up;
  }else{
    ret->intf.up = ndn_unix_server_face_up;
  }
  ret->intf.down = ndn_unix_face_down;
  ret->intf.send = ndn_unix_face_send;
  ret->intf.destroy = ndn_unix_face_destroy;

  ret->addr.sun_family = AF_UNIX;
  if (addr[0] == '\0') {
    // Hidden path
    ret->addr.sun_path[0] = '\0';
    strncpy(ret->addr.sun_path + 1, addr + 1, sizeof(ret->addr.sun_path) - 2);
  } else {
    strncpy(ret->addr.sun_path, addr, sizeof(ret->addr.sun_path) - 1);
  }

  ret->client = client;
  ret->sock = -1;
  ret->offset = 0;
  ret->process_event = NULL;
  ndn_face_up(&ret->intf);

  return ret;
}